

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O0

bool __thiscall
ASDCP::MXF::
FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>::
Archive(FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
        *this,MemIOWriter *Writer)

{
  const_iterator this_00;
  bool bVar1;
  ui32_t i_00;
  int iVar2;
  size_type sVar3;
  pointer pAVar4;
  byte local_59;
  __normal_iterator<const_Kumu::ArchivableUi16_*,_std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
  local_40;
  ArchivableUi16 *local_38;
  byte local_29;
  const_iterator cStack_28;
  bool result;
  const_iterator i;
  MemIOWriter *Writer_local;
  FixedSizeItemCollection<std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
  *this_local;
  
  i._M_current = (ArchivableUi16 *)Writer;
  sVar3 = std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>::size
                    (&this->
                      super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>);
  bVar1 = Kumu::MemIOWriter::WriteUi32BE(Writer,(ui32_t)sVar3);
  this_00 = i;
  if (bVar1) {
    i_00 = ItemSize(this);
    bVar1 = Kumu::MemIOWriter::WriteUi32BE((MemIOWriter *)this_00._M_current,i_00);
    if (bVar1) {
      bVar1 = std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>::empty
                        (&this->
                          super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>)
      ;
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        __gnu_cxx::
        __normal_iterator<const_Kumu::ArchivableUi16_*,_std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
        ::__normal_iterator(&stack0xffffffffffffffd8);
        local_29 = 1;
        local_38 = (ArchivableUi16 *)
                   std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>::begin
                             (&this->
                               super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>
                             );
        cStack_28 = (const_iterator)local_38;
        while( true ) {
          local_40._M_current =
               (ArchivableUi16 *)
               std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>::end
                         (&this->
                           super_vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>
                         );
          bVar1 = __gnu_cxx::operator!=(&stack0xffffffffffffffd8,&local_40);
          local_59 = 0;
          if (bVar1) {
            local_59 = local_29;
          }
          if ((local_59 & 1) == 0) break;
          pAVar4 = __gnu_cxx::
                   __normal_iterator<const_Kumu::ArchivableUi16_*,_std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
                   ::operator->(&stack0xffffffffffffffd8);
          iVar2 = (*(pAVar4->super_IArchive)._vptr_IArchive[4])(pAVar4,i._M_current);
          local_29 = (byte)iVar2 & 1;
          __gnu_cxx::
          __normal_iterator<const_Kumu::ArchivableUi16_*,_std::vector<Kumu::ArchivableUi16,_std::allocator<Kumu::ArchivableUi16>_>_>
          ::operator++(&stack0xffffffffffffffd8);
        }
        this_local._7_1_ = (bool)(local_29 & 1);
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Archive(Kumu::MemIOWriter* Writer) const {
	    if ( ! Writer->WriteUi32BE((ui32_t)this->size()) ) return false;
	    if ( ! Writer->WriteUi32BE((ui32_t)this->ItemSize()) ) return false;
	    if ( this->empty() ) return true;
	    
	    typename ContainerType::const_iterator i;
	    bool result = true;
	    for ( i = this->begin(); i != this->end() && result; ++i )
	      {
		result = i->Archive(Writer);
	      }

	    return result;
	  }